

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

char32_t anon_unknown.dwarf_1033bf::decodeUtf8Character(string *source,size_t *index)

{
  char *pcVar1;
  ulong uStack_30;
  int b;
  size_t i;
  ulong uStack_20;
  int value;
  size_t extraBytes;
  size_t *index_local;
  string *source_local;
  
  uStack_20 = 0;
  *index = *index + 1;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)source);
  i._4_4_ = (char32_t)*pcVar1;
  if ((i._4_4_ & 0xe0U) == 0xc0) {
    uStack_20 = 1;
    i._4_4_ = i._4_4_ & 0x1f;
  }
  else if ((i._4_4_ & 0xf0U) == 0xe0) {
    uStack_20 = 2;
    i._4_4_ = i._4_4_ & 0xf;
  }
  for (uStack_30 = 0; uStack_30 < uStack_20; uStack_30 = uStack_30 + 1) {
    *index = *index + 1;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)source);
    i._4_4_ = i._4_4_ << 6 | (int)*pcVar1 & 0x3fU;
  }
  return i._4_4_;
}

Assistant:

char32_t decodeUtf8Character(const std::string &source, size_t &index)
	{
		size_t extraBytes = 0;
		int value = source[index++];

		if ((value & 0xE0) == 0xC0)
		{
			extraBytes = 1;
			value &= 0x1F;
		} else if ((value & 0xF0) == 0xE0)
		{
			extraBytes = 2;
			value &= 0x0F;
		}

		for (size_t i = 0; i < extraBytes; i++)
		{
			int b = source[index++];
			value = (value << 6) | (b & 0x3F);
		}

		return char32_t(value);
	}